

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O2

bool __thiscall
helics::zeromq::ZmqCommsSS::processTxControlCmd
          (ZmqCommsSS *this,ActionMessage *cmd,
          map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *routes,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *connection_info)

{
  int iVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  iVar1 = cmd->messageID;
  if (iVar1 == 0xe9) {
    for (p_Var3 = (connection_info->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(connection_info->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      __y._M_str = *(char **)(p_Var3 + 2);
      __y._M_len = (size_t)p_Var3[2]._M_parent;
      __x._M_str = (char *)(cmd->payload).heap;
      __x._M_len = (cmd->payload).bufferSize;
      bVar2 = std::operator==(__x,__y);
      if (bVar2) {
        local_40._M_len = CONCAT44(local_40._M_len._4_4_,(cmd->dest_handle).hid);
        std::
        _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::route_id_const,std::__cxx11::string>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::__cxx11::string>>>
        ::_M_emplace_unique<helics::route_id,std::__cxx11::string_const&>
                  ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::route_id_const,std::__cxx11::string>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::__cxx11::string>>>
                    *)routes,(route_id *)&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                  );
        return false;
      }
    }
  }
  else if (iVar1 == 0xf4) {
    local_40._M_len = CONCAT44(local_40._M_len._4_4_,(cmd->dest_handle).hid);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(&routes->_M_t,(key_type *)&local_40);
  }
  else if (iVar1 == 299) {
    if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
      local_40._M_len = (cmd->payload).bufferSize;
      local_40._M_str = (char *)(cmd->payload).heap;
      local_30._M_len = local_40._M_len;
      local_30._M_str = local_40._M_str;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      _M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)connection_info,&local_40,&local_30);
    }
  }
  else {
    if ((iVar1 == 0x16570bf) || (iVar1 == 0x9db)) {
      return true;
    }
    if (iVar1 == 0x7cd) {
      CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
      return false;
    }
  }
  return false;
}

Assistant:

bool ZmqCommsSS::processTxControlCmd(const ActionMessage& cmd,
                                     std::map<route_id, std::string>& routes,
                                     std::map<std::string, std::string>& connection_info)
{
    bool close_tx{false};

    switch (cmd.messageID) {
        case RECONNECT_TRANSMITTER:
            setTxStatus(ConnectionStatus::CONNECTED);
            break;
        case CONNECTION_INFORMATION:
            // Shouldn't reach here ideally
            if (serverMode) {
                connection_info.emplace(cmd.name(), cmd.payload.to_string());
            }
            break;
        case NEW_ROUTE:
            for (auto& mc : connection_info) {
                if (mc.second == cmd.payload.to_string()) {
                    routes.emplace(route_id(cmd.getExtraData()), mc.first);
                    break;
                }
            }
            break;
        case REMOVE_ROUTE:
            routes.erase(route_id(cmd.getExtraData()));
            break;
        case CLOSE_RECEIVER:
        case DISCONNECT:
            close_tx = true;
            break;
    }
    return close_tx;
}